

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Sprs_array_get_block
              (int s_a,int irow,int icol,int **idx,int **jdx,void **data,int *ilo,int *ihi,int *jlo,
              int *jhi)

{
  logical lVar1;
  undefined8 *in_RCX;
  undefined8 *in_R8;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int ret;
  void *jd;
  void *id;
  Integer jh;
  Integer jl;
  Integer ih;
  Integer il;
  Integer ic;
  Integer ir;
  Integer sa;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_58;
  undefined4 local_50;
  
  lVar1 = pnga_sprs_array_get_block
                    (il,ih,jl,(void **)jh,(void **)id,(void **)jd,(Integer *)sa,(Integer *)data,
                     (Integer *)jdx,(Integer *)idx);
  *in_stack_00000008 = local_50 + -1;
  *in_stack_00000010 = local_58 + -1;
  *in_stack_00000018 = local_60 + -1;
  *in_stack_00000020 = local_68 + -1;
  *in_RCX = local_70;
  *in_R8 = local_78;
  return (int)lVar1;
}

Assistant:

int NGA_Sprs_array_get_block(int s_a, int irow, int icol, int **idx,
    int **jdx, void **data, int *ilo, int *ihi, int *jlo, int *jhi)
{
  Integer sa = (Integer)s_a;
  Integer ir = (Integer)irow;
  Integer ic = (Integer)icol;
  Integer il, ih, jl, jh;
  void *id, *jd;
  int ret = wnga_sprs_array_get_block(sa, ir, ic, &id, &jd, data,
      &il, &ih, &jl, &jh);
  *ilo = (int)il-1;
  *ihi = (int)ih-1;
  *jlo = (int)jl-1;
  *jhi = (int)jh-1;
  *idx = (int*)id;
  *jdx = (int*)jd;
  return ret;
}